

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::CharacterFetcher<(TI::TMS::Personality)0>::CharacterFetcher
          (CharacterFetcher<(TI::TMS::Personality)0> *this,Base<(TI::TMS::Personality)0> *base,
          uint8_t y)

{
  ushort uVar1;
  ScreenMode SVar2;
  ushort uVar3;
  ushort uVar4;
  undefined3 in_register_00000011;
  
  this->base = base;
  this->y = y;
  this->row_base =
       ((ushort)CONCAT31(in_register_00000011,y) & 0xfff8) * 4 - 0x400 & base->pattern_name_address_
  ;
  uVar4 = base->pattern_generator_table_address_;
  this->pattern_base = uVar4;
  uVar1 = base->colour_table_address_;
  this->colour_base = uVar1;
  this->colour_name_shift = 6;
  SVar2 = base->fetch_line_buffer_->screen_mode;
  if ((SVar2 == YamahaGraphics3) || (SVar2 == Graphics)) {
    uVar3 = (y & 0xc0) << 5 | 0xe000;
    this->pattern_base = uVar4 & uVar3;
    this->colour_base = (ushort)(y & 7) | uVar1 & uVar3;
    this->colour_name_shift = 0;
  }
  else {
    this->colour_base = uVar1 & 0xffc0;
    this->pattern_base = uVar4 & 0xf800;
  }
  uVar4 = (ushort)(y >> 2);
  if (SVar2 != MultiColour) {
    uVar4 = (ushort)y;
  }
  this->pattern_base = this->pattern_base + (uVar4 & 7);
  return;
}

Assistant:

CharacterFetcher(Base<personality> *base, uint8_t y) :
		base(base),
		y(y),
		row_base(base->pattern_name_address_ & bits<10>(AddressT((y << 2)&~31)))
	{
		pattern_base = base->pattern_generator_table_address_;
		colour_base = base->colour_table_address_;
		colour_name_shift = 6;

		const ScreenMode mode = base->fetch_line_buffer_->screen_mode;
		if(mode == ScreenMode::Graphics || mode == ScreenMode::YamahaGraphics3) {
			// If this is high resolution mode, allow the row number to affect the pattern and colour addresses.
			pattern_base &= bits<13>(AddressT(((y & 0xc0) << 5)));
			colour_base &= bits<13>(AddressT(((y & 0xc0) << 5)));

			colour_base += AddressT(y & 7);
			colour_name_shift = 0;
		} else {
			colour_base &= bits<6, AddressT>();
			pattern_base &= bits<11, AddressT>();
		}

		if(mode == ScreenMode::MultiColour) {
			pattern_base += AddressT((y >> 2) & 7);
		} else {
			pattern_base += AddressT(y & 7);
		}
	}